

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O2

void __thiscall QFbScreen::initializeCompositor(QFbScreen *this)

{
  long in_FS_OFFSET;
  QSize local_38;
  QImage local_30 [24];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = QRect::size((QRect *)(this + 0x50));
  QImage::QImage(local_30,&local_38,*(Format *)(this + 100));
  QImage::operator=((QImage *)(this + 0x78),local_30);
  QImage::~QImage(local_30);
  scheduleUpdate(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::initializeCompositor()
{
    mScreenImage = QImage(mGeometry.size(), mFormat);
    scheduleUpdate();
}